

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
* __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
::ParseStream<272u,rapidjson::UTF8<char>,rapidjson::BasicIStreamWrapper<std::istream>>
          (GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
           *this,BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is)

{
  undefined8 uVar1;
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  *pGVar2;
  RapidJSONException *this_00;
  ParseResult PVar3;
  ClearStackOnExit scope;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> reader;
  
  if (*(long *)(this + 0x20) == 0) {
    reader.stack_.allocator_ = (CrtAllocator *)0x0;
  }
  else {
    reader.stack_.allocator_ =
         internal::Stack<rapidjson::CrtAllocator>::GetAllocator
                   ((Stack<rapidjson::CrtAllocator> *)(this + 0x20));
  }
  reader.stack_.ownAllocator_ = (CrtAllocator *)0x0;
  reader.stack_.stack_ = (char *)0x0;
  reader.stack_.stackTop_ = (char *)0x0;
  reader.stack_.stackEnd_ = (char *)0x0;
  reader.stack_.initialCapacity_ = 0x100;
  reader.parseResult_.code_ = kParseErrorNone;
  reader.parseResult_.offset_ = 0;
  reader.state_ = IterativeParsingStartState;
  scope.d_ = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              *)this;
  PVar3 = GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
          Parse<272u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    ((GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>
                      *)&reader,is,
                     (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)this);
  *(ParseErrorCode *)(this + 0x50) = PVar3.code_;
  *(size_t *)(this + 0x58) = PVar3.offset_;
  if (PVar3.code_ == kParseErrorNone) {
    if (*(long *)(this + 0x38) - *(long *)(this + 0x30) != 0x10) {
      this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
      cereal::RapidJSONException::RapidJSONException
                (this_00,
                 "rapidjson internal assertion failure: stack_.GetSize() == sizeof(ValueType)");
      __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
    }
    pGVar2 = (GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)internal::Stack<rapidjson::CrtAllocator>::
                Pop<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          ((Stack<rapidjson::CrtAllocator> *)(this + 0x20),1);
    if (pGVar2 != this) {
      uVar1 = *(undefined8 *)(pGVar2 + 8);
      *(undefined8 *)this = *(undefined8 *)pGVar2;
      *(undefined8 *)(this + 8) = uVar1;
      *(undefined2 *)(pGVar2 + 0xe) = 0;
    }
  }
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::ClearStackOnExit::~ClearStackOnExit(&scope);
  internal::Stack<rapidjson::CrtAllocator>::~Stack(&reader.stack_);
  return (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *)this;
}

Assistant:

GenericDocument& ParseStream(InputStream& is) {
        GenericReader<SourceEncoding, Encoding, StackAllocator> reader(
            stack_.HasAllocator() ? &stack_.GetAllocator() : 0);
        ClearStackOnExit scope(*this);
        parseResult_ = reader.template Parse<parseFlags>(is, *this);
        if (parseResult_) {
            CEREAL_RAPIDJSON_ASSERT(stack_.GetSize() == sizeof(ValueType)); // Got one and only one root object
            ValueType::operator=(*stack_.template Pop<ValueType>(1));// Move value from stack to document
        }
        return *this;
    }